

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

void __thiscall
crnlib::dxt1_endpoint_optimizer::compute_endpoint_component_errors
          (dxt1_endpoint_optimizer *this,uint comp_index,uint64 (*error) [4] [256],
          uint64 (*best_remaining_error) [4])

{
  uint uVar1;
  uint64 uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  unique_color *puVar6;
  byte *pbVar7;
  byte local_e8;
  byte local_d5;
  uint local_d4;
  uint8 s_3;
  ulong uStack_d0;
  uint p_2;
  uint64 e;
  uint64 dd;
  uint64 d;
  uint64 best_error_1;
  uint8 s_2;
  uint8 p_1;
  uint64 uStack_a8;
  uint8 c;
  uint64 best_error;
  uint8 s_1;
  uint comp_limit;
  uint8 s;
  uint w;
  uint p;
  uint i;
  uint64 WPP [4];
  uint64 WP2 [4];
  uint64 W [4];
  uint64 (*best_remaining_error_local) [4];
  uint64 (*error_local) [4] [256];
  uint comp_index_local;
  dxt1_endpoint_optimizer *this_local;
  
  memset(WP2 + 3,0,0x20);
  memset(WPP + 3,0,0x20);
  memset(&p,0,0x20);
  w = 0;
  while( true ) {
    uVar4 = vector<crnlib::unique_color>::size(&this->m_unique_colors);
    if (uVar4 <= w) break;
    puVar6 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,w);
    pbVar7 = color_quad<unsigned_char,_int>::operator[](&puVar6->m_color,comp_index);
    uVar5 = (uint)*pbVar7;
    puVar6 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,w);
    uVar1 = puVar6->m_weight;
    pbVar7 = vector<unsigned_char>::operator[](&(this->m_best_solution).m_selectors,w);
    bVar3 = *pbVar7;
    WP2[(ulong)bVar3 + 3] = (ulong)uVar1 + WP2[(ulong)bVar3 + 3];
    WPP[(ulong)bVar3 + 3] = (ulong)uVar1 * (ulong)uVar5 * 2 + WPP[(ulong)bVar3 + 3];
    *(ulong *)(&p + (ulong)bVar3 * 2) =
         (ulong)uVar1 * (ulong)uVar5 * (ulong)uVar5 + *(long *)(&p + (ulong)bVar3 * 2);
    w = w + 1;
  }
  bVar3 = 0x20;
  if (comp_index == 1) {
    bVar3 = 0x40;
  }
  for (best_error._3_1_ = 0; best_error._3_1_ < 2; best_error._3_1_ = best_error._3_1_ + 1) {
    uStack_a8 = *(uint64 *)(&p + (ulong)best_error._3_1_ * 2);
    (*error)[best_error._3_1_][0] = uStack_a8;
    for (best_error_1._7_1_ = 1; best_error_1._7_1_ < bVar3;
        best_error_1._7_1_ = best_error_1._7_1_ + 1) {
      if (comp_index == 1) {
        local_e8 = best_error_1._7_1_ << 2 | (byte)((int)(uint)best_error_1._7_1_ >> 4);
      }
      else {
        local_e8 = best_error_1._7_1_ << 3 | (byte)((int)(uint)best_error_1._7_1_ >> 2);
      }
      (*error)[best_error._3_1_][best_error_1._7_1_] =
           (WP2[(ulong)best_error._3_1_ + 3] * (ulong)local_e8 * (ulong)local_e8 -
           WPP[(ulong)best_error._3_1_ + 3] * (ulong)local_e8) +
           *(long *)(&p + (ulong)best_error._3_1_ * 2);
      if ((*error)[best_error._3_1_][best_error_1._7_1_] < uStack_a8) {
        uStack_a8 = (*error)[best_error._3_1_][best_error_1._7_1_];
      }
    }
    (*best_remaining_error)[best_error._3_1_] = uStack_a8;
  }
  for (best_error_1._5_1_ = 2; best_error_1._5_1_ < 4; best_error_1._5_1_ = best_error_1._5_1_ + 1)
  {
    d = *(uint64 *)(&p + (ulong)best_error_1._5_1_ * 2);
    (*error)[best_error_1._5_1_][0] = d;
    dd = WP2[(ulong)best_error_1._5_1_ + 3] - WPP[(ulong)best_error_1._5_1_ + 3];
    uVar2 = WP2[(ulong)best_error_1._5_1_ + 3];
    uStack_d0 = *(long *)(&p + (ulong)best_error_1._5_1_ * 2) + dd;
    for (local_d4 = 1; local_d4 < 0x100; local_d4 = local_d4 + 1) {
      (*error)[best_error_1._5_1_][local_d4] = uStack_d0;
      if (uStack_d0 < d) {
        d = uStack_d0;
      }
      dd = uVar2 * 2 + dd;
      uStack_d0 = dd + uStack_d0;
    }
    (*best_remaining_error)[best_error_1._5_1_] = d;
  }
  for (local_d5 = 3; local_d5 != 0; local_d5 = local_d5 - 1) {
    (*best_remaining_error)[(int)(local_d5 - 1)] =
         (*best_remaining_error)[local_d5] + (*best_remaining_error)[(int)(local_d5 - 1)];
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::compute_endpoint_component_errors(uint comp_index, uint64 (&error)[4][256], uint64 (&best_remaining_error)[4])
    {
        uint64 W[4] = {}, WP2[4] = {}, WPP[4] = {};
        for (uint i = 0; i < m_unique_colors.size(); i++)
        {
            uint p = m_unique_colors[i].m_color[comp_index];
            uint w = m_unique_colors[i].m_weight;
            uint8 s = m_best_solution.m_selectors[i];
            W[s] += (int64)w;
            WP2[s] += (int64)w * p * 2;
            WPP[s] += (int64)w * p * p;
        }
        const uint comp_limit = comp_index == 1 ? 64 : 32;
        for (uint8 s = 0; s < 2; s++)
        {
            uint64 best_error = error[s][0] = WPP[s];
            for (uint8 c = 1; c < comp_limit; c++)
            {
                uint8 p = comp_index == 1 ? c << 2 | c >> 4 : c << 3 | c >> 2;
                error[s][c] = W[s] * p * p - WP2[s] * p + WPP[s];
                if (error[s][c] < best_error)
                {
                    best_error = error[s][c];
                }
            }
            best_remaining_error[s] = best_error;
        }
        for (uint8 s = 2; s < 4; s++)
        {
            uint64 best_error = error[s][0] = WPP[s], d = W[s] - WP2[s], dd = W[s] << 1, e = WPP[s] + d;
            for (uint p = 1; p < 256; p++, d += dd, e += d)
            {
                error[s][p] = e;
                if (e < best_error)
                {
                    best_error = e;
                }
            }
            best_remaining_error[s] = best_error;
        }
        for (uint8 s = 3; s; s--)
        {
            best_remaining_error[s - 1] += best_remaining_error[s];
        }
    }